

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int64_t av1_block_error_qm(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,
                          qm_val_t *qmatrix,int16_t *scan,int64_t *ssz,int bd)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar4 = 0;
  if (block_size < 1) {
    block_size = lVar4;
  }
  lVar6 = 0;
  lVar1 = 0;
  for (; block_size != lVar4; lVar4 = lVar4 + 1) {
    lVar5 = ((long)coeff[lVar4] - (long)dqcoeff[lVar4]) * (ulong)qmatrix[scan[lVar4]];
    lVar7 = (long)coeff[lVar4] * (ulong)qmatrix[scan[lVar4]];
    lVar1 = lVar1 + (lVar5 * lVar5 + 0x200U >> 10);
    lVar6 = lVar6 + (lVar7 * lVar7 + 0x200U >> 10);
  }
  bVar2 = (char)bd * '\x02' - 0x10;
  uVar3 = (ulong)((uint)(1 << (bVar2 & 0x1f)) >> 1);
  *ssz = lVar6 + uVar3 >> (bVar2 & 0x3f);
  return lVar1 + uVar3 >> (bVar2 & 0x3f);
}

Assistant:

static inline int64_t av1_block_error_qm(
    const tran_low_t *coeff, const tran_low_t *dqcoeff, intptr_t block_size,
    const qm_val_t *qmatrix, const int16_t *scan, int64_t *ssz, int bd) {
  int i;
  int64_t error = 0, sqcoeff = 0;
  int shift = 2 * (bd - 8);
  int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i++) {
    int64_t weight = qmatrix[scan[i]];
    int64_t dd = coeff[i] - dqcoeff[i];
    dd *= weight;
    int64_t cc = coeff[i];
    cc *= weight;
    // The ranges of coeff and dqcoeff are
    //  bd8 : 18 bits (including sign)
    //  bd10: 20 bits (including sign)
    //  bd12: 22 bits (including sign)
    // As AOM_QM_BITS is 5, the intermediate quantities in the calculation
    // below should fit in 54 bits, thus no overflow should happen.
    error += (dd * dd + (1 << (2 * AOM_QM_BITS - 1))) >> (2 * AOM_QM_BITS);
    sqcoeff += (cc * cc + (1 << (2 * AOM_QM_BITS - 1))) >> (2 * AOM_QM_BITS);
  }

  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}